

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall cmDocumentation::addCommonStandardDocSections(cmDocumentation *this)

{
  undefined1 local_48 [8];
  cmDocumentationSection sec;
  cmDocumentation *this_local;
  
  sec.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cmDocumentationSection::cmDocumentationSection((cmDocumentationSection *)local_48,"Options");
  cmDocumentationSection::Append((cmDocumentationSection *)local_48,cmDocumentationStandardOptions);
  std::
  map<std::__cxx11::string,cmDocumentationSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
  ::emplace<char_const(&)[8],cmDocumentationSection>
            ((map<std::__cxx11::string,cmDocumentationSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
              *)&this->AllSections,(char (*) [8])0xd1a9d6,(cmDocumentationSection *)local_48);
  cmDocumentationSection::~cmDocumentationSection((cmDocumentationSection *)local_48);
  return;
}

Assistant:

void cmDocumentation::addCommonStandardDocSections()
{
  cmDocumentationSection sec{ "Options" };
  sec.Append(cmDocumentationStandardOptions);
  this->AllSections.emplace("Options", std::move(sec));
}